

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void residue_suite::parse_null(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_05;
  reader *reader_00;
  error_code eVar2;
  view_type local_530;
  undefined4 local_51c;
  int local_518 [2];
  error_category *local_510;
  undefined4 local_504;
  value local_500 [2];
  undefined1 local_4f8 [8];
  basic_variable<std::allocator<char>_> result_1;
  undefined1 local_4b8 [8];
  reader reader;
  string local_368 [8];
  string input_6;
  error *ex_4;
  allocator<char> local_2d9;
  string local_2d8 [8];
  string input_5;
  error *ex_3;
  allocator<char> local_249;
  string local_248 [8];
  string input_4;
  error *ex_2;
  allocator<char> local_1b9;
  string local_1b8 [8];
  string input_3;
  error *ex_1;
  allocator<char> local_129;
  string local_128 [8];
  string input_2;
  error *ex;
  allocator<char> local_99;
  string local_98 [8];
  string input_1;
  basic_variable<std::allocator<char>_> result;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28,"null ",&local_29);
  std::allocator<char>::~allocator(&local_29);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)((long)&input_1.field_2 + 8),(json *)local_28,
             input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)((long)&input_1.field_2 + 8));
  boost::detail::test_impl
            ("result.same<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x282,"void residue_suite::parse_null()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)((long)&input_1.field_2 + 8));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"null,",&local_99);
  std::allocator<char>::~allocator(&local_99);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex,(json *)local_98,input_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x289,"void residue_suite::parse_null()");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"null true",&local_129);
  std::allocator<char>::~allocator(&local_129);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex_1,(json *)local_128,input_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x290,"void residue_suite::parse_null()");
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"null\"zulu\"",&local_1b9);
  std::allocator<char>::~allocator(&local_1b9);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex_2,(json *)local_1b8,input_03);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x297,"void residue_suite::parse_null()");
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"null[]",&local_249);
  std::allocator<char>::~allocator(&local_249);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex_3,(json *)local_248,input_04);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x29e,"void residue_suite::parse_null()");
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"null{}",&local_2d9);
  std::allocator<char>::~allocator(&local_2d9);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex_4,(json *)local_2d8,input_05);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_4);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2a5,"void residue_suite::parse_null()");
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"null[]",
             (allocator<char> *)
             ((long)&reader.stack.c.
                     super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&reader.stack.c.
                     super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  result_1.storage._40_8_ = std::__cxx11::string::operator_cast_to_basic_string_view(local_368);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_4b8,(view_type *)&result_1.storage.field_0x28);
  trial::protocol::json::partial::parse<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_4f8,(partial *)local_4b8,reader_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)local_4f8);
  boost::detail::test_impl
            ("result.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ac,"void residue_suite::parse_null()",bVar1);
  local_500[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_4b8);
  local_504 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ad,"void residue_suite::parse_null()",local_500,&local_504);
  eVar2 = trial::protocol::json::basic_reader<char>::error((basic_reader<char> *)local_4b8);
  local_510 = eVar2._M_cat;
  local_518[0] = eVar2._M_value;
  local_51c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ae,"void residue_suite::parse_null()",local_518,&local_51c);
  local_530 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_4b8);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2af,"void residue_suite::parse_null()",&local_530,"[");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4f8);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_4b8);
  std::__cxx11::string::~string(local_368);
  return;
}

Assistant:

void parse_null()
{
    // Trailing whitespace
    {
        std::string input = "null ";
        auto result = json::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<nullable>());
    }
    // Trailing separator
    {
        std::string input = "null,";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing value
    {
        std::string input = "null true";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing string
    {
        std::string input = "null\"zulu\"";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing array
    {
        std::string input = "null[]";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing object
    {
        std::string input = "null{}";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Partial
    {
        std::string input = "null[]";
        json::reader reader(input);
        auto result = json::partial::parse(reader);
        TRIAL_PROTOCOL_TEST(result.is<nullable>());
        TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::error);
        TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
        TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    }
}